

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloom_filter.cpp
# Opt level: O3

bool libtorrent::aux::has_bits(uint8_t *k,uint8_t *bits,int len)

{
  ulong uVar1;
  bool bVar2;
  
  bVar2 = false;
  uVar1 = (ulong)*(ushort *)k % (ulong)(uint)(len << 3);
  if ((bits[uVar1 >> 3] >> ((uint)uVar1 & 7) & 1) != 0) {
    uVar1 = (ulong)*(ushort *)(k + 2) % (ulong)(uint)(len << 3);
    bVar2 = (bits[uVar1 >> 3] >> ((uint)uVar1 & 7) & 1) != 0;
  }
  return bVar2;
}

Assistant:

bool has_bits(std::uint8_t const* k, std::uint8_t const* bits, int const len)
	{
		std::uint32_t idx1 = std::uint32_t(k[0]) | (std::uint32_t(k[1]) << 8);
		std::uint32_t idx2 = std::uint32_t(k[2]) | (std::uint32_t(k[3]) << 8);
		idx1 %= aux::numeric_cast<std::uint32_t>(len * 8);
		idx2 %= aux::numeric_cast<std::uint32_t>(len * 8);
		return (bits[idx1 / 8] & (1 << (idx1 & 7))) != 0
			&& (bits[idx2 / 8] & (1 << (idx2 & 7))) != 0;
	}